

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncurses_display_driver.cpp
# Opt level: O0

void __thiscall NcursesDisplayDriver::check_capabilities(NcursesDisplayDriver *this)

{
  long lVar1;
  int local_24;
  int x;
  int y;
  NcursesDisplayDriver *this_local;
  
  lVar1 = tigetstr("sitm");
  if ((lVar1 == 0) || (lVar1 = tigetstr("ritm"), lVar1 == 0)) {
    werase(this->_display_window);
    wattr_set(this->_display_window,0,4,0);
    wprintw(this->_display_window,"Italics capability not detected for this terminal");
    if (this->_display_window == (WINDOW *)0x0) {
      local_24 = -1;
    }
    else {
      local_24 = (int)this->_display_window->_cury;
    }
    wmove(this->_display_window,local_24 + 1,0);
    wprintw(this->_display_window,"Press any key to continue");
    wrefresh(this->_display_window);
    sleep(1);
    wgetch(_stdscr);
  }
  return;
}

Assistant:

void NcursesDisplayDriver::check_capabilities(void) const {
	if (!tigetstr("sitm") or !tigetstr("ritm")) {
		werase(_display_window);
		wattr_set(_display_window, A_NORMAL, RED_PAIR, nullptr);
		wprintw(_display_window, "Italics capability not detected for this terminal");
		int y, x; // x required for getyx
		getyx(_display_window, y, x);
		wmove(_display_window, y+1, 0);
		wprintw(_display_window, "Press any key to continue");
		wrefresh(_display_window);
		sleep(1);
		getch();
	}
}